

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_batch_insert.cpp
# Opt level: O1

SinkNextBatchType __thiscall
duckdb::PhysicalBatchInsert::NextBatch
          (PhysicalBatchInsert *this,ExecutionContext *context,OperatorSinkNextBatchInput *input)

{
  BatchInsertGlobalState *this_00;
  LocalSinkState *lstate_p;
  ClientContext *pCVar1;
  _func_int **batch_index;
  TransactionData transaction;
  bool bVar2;
  int iVar3;
  _func_int **pp_Var4;
  undefined4 extraout_var;
  RowGroupCollection *this_01;
  idx_t min_batch_index;
  InternalException *this_02;
  unique_lock<std::mutex> guard;
  unique_lock<std::mutex> guard_1;
  undefined1 local_60 [8];
  bool bStack_58;
  undefined7 uStack_57;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_50;
  unique_lock<std::mutex> local_40;
  
  this_00 = (BatchInsertGlobalState *)input->global_state;
  lstate_p = input->local_state;
  pp_Var4 = (_func_int **)optional_idx::GetIndex(&(lstate_p->partition_info).batch_index);
  if (lstate_p[6].partition_info.partition_data.
      super_vector<duckdb::ColumnPartitionData,_std::allocator<duckdb::ColumnPartitionData>_>.
      super__Vector_base<duckdb::ColumnPartitionData,_std::allocator<duckdb::ColumnPartitionData>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0xffffffffffffffff) {
    if (lstate_p[1]._vptr_LocalSinkState == pp_Var4) {
      this_02 = (InternalException *)__cxa_allocate_exception(0x10);
      local_60 = (undefined1  [8])&local_50;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_60,"NextBatch called with the same batch index?","");
      InternalException::InternalException(this_02,(string *)local_60);
      __cxa_throw(this_02,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
    }
    TransactionData::TransactionData((TransactionData *)local_60,0,0);
    iVar3 = (*(this_00->table->super_TableCatalogEntry).super_StandardEntry.super_InCatalogEntry.
              super_CatalogEntry._vptr_CatalogEntry[0x10])();
    this_01 = DataTable::GetOptimisticCollection
                        ((DataTable *)CONCAT44(extraout_var,iVar3),context->client,
                         (PhysicalIndex)
                         lstate_p[6].partition_info.partition_data.
                         super_vector<duckdb::ColumnPartitionData,_std::allocator<duckdb::ColumnPartitionData>_>
                         .
                         super__Vector_base<duckdb::ColumnPartitionData,_std::allocator<duckdb::ColumnPartitionData>_>
                         ._M_impl.super__Vector_impl_data._M_start);
    transaction.transaction_id._1_7_ = uStack_57;
    transaction.transaction_id._0_1_ = bStack_58;
    transaction.transaction.ptr = (DuckTransaction *)local_60;
    transaction.start_time = local_50._M_allocated_capacity;
    RowGroupCollection::FinalizeAppend
              (this_01,transaction,(TableAppendState *)&lstate_p[1].partition_info);
    pCVar1 = context->client;
    batch_index = lstate_p[1]._vptr_LocalSinkState;
    min_batch_index = optional_idx::GetIndex(&(lstate_p->partition_info).min_batch_index);
    BatchInsertGlobalState::AddCollection
              (this_00,pCVar1,(idx_t)batch_index,min_batch_index,
               (PhysicalIndex)
               lstate_p[6].partition_info.partition_data.
               super_vector<duckdb::ColumnPartitionData,_std::allocator<duckdb::ColumnPartitionData>_>
               .
               super__Vector_base<duckdb::ColumnPartitionData,_std::allocator<duckdb::ColumnPartitionData>_>
               ._M_impl.super__Vector_impl_data._M_start,
               (OptimisticDataWriter *)
               lstate_p[6].partition_info.partition_data.
               super_vector<duckdb::ColumnPartitionData,_std::allocator<duckdb::ColumnPartitionData>_>
               .
               super__Vector_base<duckdb::ColumnPartitionData,_std::allocator<duckdb::ColumnPartitionData>_>
               ._M_impl.super__Vector_impl_data._M_finish);
    local_40._M_device = &(this_00->memory_manager).super_StateWithBlockableTasks.lock;
    local_40._M_owns = false;
    ::std::unique_lock<std::mutex>::lock(&local_40);
    local_40._M_owns = true;
    bVar2 = StateWithBlockableTasks::UnblockTasks
                      (&(this_00->memory_manager).super_StateWithBlockableTasks,&local_40);
    ::std::unique_lock<std::mutex>::~unique_lock(&local_40);
    if (!bVar2) {
      pCVar1 = context->client;
      do {
        bVar2 = ExecuteTask(this,pCVar1,(GlobalSinkState *)this_00,lstate_p);
      } while (bVar2);
    }
    lstate_p[6].partition_info.partition_data.
    super_vector<duckdb::ColumnPartitionData,_std::allocator<duckdb::ColumnPartitionData>_>.
    super__Vector_base<duckdb::ColumnPartitionData,_std::allocator<duckdb::ColumnPartitionData>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0xffffffffffffffff;
  }
  lstate_p[1]._vptr_LocalSinkState = pp_Var4;
  local_60 = (undefined1  [8])&(this_00->memory_manager).super_StateWithBlockableTasks.lock;
  bStack_58 = false;
  ::std::unique_lock<std::mutex>::lock((unique_lock<std::mutex> *)local_60);
  bStack_58 = true;
  StateWithBlockableTasks::UnblockTasks
            (&(this_00->memory_manager).super_StateWithBlockableTasks,
             (unique_lock<std::mutex> *)local_60);
  ::std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)local_60);
  return READY;
}

Assistant:

SinkNextBatchType PhysicalBatchInsert::NextBatch(ExecutionContext &context, OperatorSinkNextBatchInput &input) const {
	auto &gstate = input.global_state.Cast<BatchInsertGlobalState>();
	auto &lstate = input.local_state.Cast<BatchInsertLocalState>();
	auto &memory_manager = gstate.memory_manager;

	auto batch_index = lstate.partition_info.batch_index.GetIndex();
	if (lstate.collection_index.IsValid()) {
		if (lstate.current_index == batch_index) {
			throw InternalException("NextBatch called with the same batch index?");
		}
		// batch index has changed: move the old collection to the global state and create a new collection
		TransactionData tdata(0, 0);
		auto &collection = gstate.table.GetStorage().GetOptimisticCollection(context.client, lstate.collection_index);
		collection.FinalizeAppend(tdata, lstate.current_append_state);
		gstate.AddCollection(context.client, lstate.current_index, lstate.partition_info.min_batch_index.GetIndex(),
		                     lstate.collection_index, lstate.optimistic_writer);

		bool any_unblocked;
		{
			auto guard = memory_manager.Lock();
			any_unblocked = memory_manager.UnblockTasks(guard);
		}
		if (!any_unblocked) {
			ExecuteTasks(context.client, gstate, lstate);
		}
		lstate.collection_index.index = DConstants::INVALID_INDEX;
	}
	lstate.current_index = batch_index;

	// unblock any blocked tasks
	auto guard = memory_manager.Lock();
	memory_manager.UnblockTasks(guard);

	return SinkNextBatchType::READY;
}